

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **arg)

{
  float fVar1;
  iterator __position;
  float *pfVar2;
  pointer piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  ParameterObj par;
  ModelInstance *pMVar8;
  vector<float,_std::allocator<float>_> *this;
  pointer __s;
  pointer paVar9;
  pointer ppMVar10;
  ostream *poVar11;
  long *plVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  int *piVar16;
  int iVar17;
  NetworkArray *pNVar18;
  ulong uVar19;
  undefined8 *puVar20;
  float *pfVar21;
  char *pcVar22;
  int i;
  int i_2;
  float *pfVar23;
  pointer paVar24;
  bool bVar25;
  int i_1;
  float *pfVar26;
  byte bVar27;
  float fVar28;
  float fVar29;
  IO myIO;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> sims;
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> states_arr;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> homotetramer_arr;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> boundarr;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> nicking_arr;
  string homotetramer_file;
  string activemoment_file;
  string dimerbinding_file;
  string states_file;
  string singleState_file;
  string homotetramermoment_file;
  string nicking_file;
  string nickingmoment_file;
  ParameterObj myparameters;
  ofstream out;
  UniformDistribution unif;
  array<std::vector<float,_std::allocator<float>_>_*,_1000UL> arr_per_sim;
  NetworkArray network;
  IO local_60f9;
  double local_60f8;
  double local_60f0;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_60e8;
  float local_60cc;
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> local_60c8;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_60a8;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> local_6088;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> local_6068;
  undefined1 *local_6048;
  long local_6040;
  undefined1 local_6038 [16];
  undefined1 *local_6028;
  long local_6020;
  undefined1 local_6018 [16];
  undefined1 *local_6008;
  long local_6000;
  undefined1 local_5ff8 [16];
  undefined1 *local_5fe8;
  long local_5fe0;
  undefined1 local_5fd8 [16];
  undefined1 *local_5fc8;
  long local_5fc0;
  undefined1 local_5fb8 [16];
  undefined1 *local_5fa8;
  long local_5fa0;
  undefined1 local_5f98 [16];
  undefined1 *local_5f88;
  long local_5f80;
  undefined1 local_5f78 [16];
  undefined1 *local_5f68;
  long local_5f60;
  undefined1 local_5f58 [16];
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> local_5f48;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5f30;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_5f18;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5f00;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> local_5ee8;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> local_5ed0;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_5eb8;
  string local_5ea0;
  string local_5e80;
  string local_5e60;
  string local_5e40;
  string local_5e20;
  string local_5e00;
  string local_5de0;
  string local_5dc0;
  undefined4 local_5da0;
  undefined4 uStack_5d9c;
  undefined4 uStack_5d98;
  undefined4 uStack_5d94;
  Substrate local_5d90;
  long local_5d88;
  filebuf local_5d80 [240];
  ios_base local_5c90 [264];
  UniformDistribution local_5b88;
  undefined8 local_3458 [1000];
  NetworkArray local_1518;
  
  bVar27 = 0;
  IO::read((IO *)&local_5da0,(int)&local_60f9,(void *)(ulong)(uint)argc,(size_t)arg);
  par.L_conc = (float)uStack_5d9c;
  par.S_conc = (float)local_5da0;
  par.top = uStack_5d94;
  par.H_conc = (float)uStack_5d98;
  par.subs = local_5d90;
  NetworkArray::NetworkArray(&local_1518,par);
  local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_start = (ModelInstance **)0x0;
  local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (ModelInstance **)0x0;
  local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ModelInstance **)0x0;
  iVar17 = 1000;
  do {
    pMVar8 = (ModelInstance *)operator_new(0x1578);
    pNVar18 = &local_1518;
    puVar20 = (undefined8 *)&stack0xffffffffffff89f8;
    for (lVar13 = 0x29c; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar20 = *(undefined8 *)(pNVar18->transitions)._M_elems[0]._M_elems;
      pNVar18 = (NetworkArray *)((long)pNVar18 + (ulong)bVar27 * -0x10 + 8);
      puVar20 = puVar20 + (ulong)bVar27 * -2 + 1;
    }
    ModelInstance::ModelInstance(pMVar8);
    local_5b88.super_Distribution._vptr_Distribution = (_func_int **)pMVar8;
    if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ModelInstance*,std::allocator<ModelInstance*>>::_M_realloc_insert<ModelInstance*>
                ((vector<ModelInstance*,std::allocator<ModelInstance*>> *)&local_60e8,
                 (iterator)
                 local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ModelInstance **)&local_5b88);
    }
    else {
      *local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
       super__Vector_impl_data._M_finish = pMVar8;
      local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pMVar8 = *local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_60f0 = (double)CONCAT44(local_60f0._4_4_,pMVar8->totaltime);
  local_60f8 = (double)CONCAT44(local_60f8._4_4_,pMVar8->dt_diff);
  local_60cc = pMVar8->dt_react;
  UniformDistribution::UniformDistribution(&local_5b88,0.0,1.0);
  lVar13 = 0;
  memset(local_3458,0,8000);
  local_60f0 = (double)local_60f0._0_4_;
  local_60f8 = (double)(2.0 / local_60f8._0_4_ + 1.0 / local_60cc) * (local_60f0 + 30.0);
  do {
    this = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (0.0 < local_60f8) {
      iVar17 = 1;
      do {
        fVar28 = UniformDistribution::getRandomNumber(&local_5b88);
        local_5d88 = CONCAT44(local_5d88._4_4_,fVar28);
        __position._M_current =
             (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (this,__position,(float *)&local_5d88);
        }
        else {
          *__position._M_current = fVar28;
          (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        dVar7 = (double)iVar17;
        iVar17 = iVar17 + 1;
      } while (dVar7 < local_60f8);
    }
    *(vector<float,_std::allocator<float>_> **)((long)local_3458 + lVar13) = this;
    lVar13 = lVar13 + 8;
  } while (lVar13 != 8000);
  uVar15 = 0;
  do {
    if ((ulong)((long)local_60e8.
                      super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_60e8.
                      super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar15) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15)
      ;
    }
    ModelInstance::main(local_60e8.
                        super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar15],
                        (vector<float,_std::allocator<float>_> *)local_3458[uVar15]);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 1000);
  local_6068.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6068.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6068.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6068.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(48000);
  local_6068.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_6068.
       super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
       super__Vector_impl_data._M_start + 3000;
  lVar13 = 0;
  do {
    puVar20 = (undefined8 *)
              ((long)(local_6068.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar13);
    *puVar20 = 0;
    puVar20[1] = 0;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 48000);
  if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppMVar10 = local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar8 = *ppMVar10;
      lVar13 = 0;
      pfVar21 = (local_6068.
                 super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 3;
      do {
        fVar28 = pMVar8->nick1;
        fVar1 = pMVar8->nick2;
        fVar29 = (float)(int)lVar13 * 0.1;
        bVar25 = fVar28 <= 0.0;
        bVar4 = fVar29 <= fVar28;
        bVar5 = fVar1 <= 0.0;
        bVar6 = fVar29 <= fVar1;
        if ((bVar4 || bVar25) && (bVar6 || bVar5)) {
          ((array<float,_4UL> *)(pfVar21 + -3))->_M_elems[0] =
               ((array<float,_4UL> *)(pfVar21 + -3))->_M_elems[0] + 0.001;
        }
        if ((!bVar4 && !bVar25) && (bVar6 || bVar5)) {
          pfVar21[-2] = pfVar21[-2] + 0.001;
        }
        if ((bVar4 || bVar25) && (!bVar6 && !bVar5)) {
          pfVar21[-1] = pfVar21[-1] + 0.001;
        }
        if ((!bVar4 && !bVar25) && (!bVar6 && !bVar5)) {
          *pfVar21 = *pfVar21 + 0.001;
        }
        lVar13 = lVar13 + 1;
        pfVar21 = pfVar21 + 4;
      } while (lVar13 != 3000);
      ppMVar10 = ppMVar10 + 1;
    } while (ppMVar10 !=
             local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6068.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6068.
       super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(48000);
  local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start + 3000;
  lVar13 = 0;
  do {
    puVar20 = (undefined8 *)
              ((long)(local_6088.
                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar13);
    *puVar20 = 0;
    puVar20[1] = 0;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 48000);
  if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppMVar10 = local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar8 = *ppMVar10;
      pfVar21 = (pMVar8->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pfVar2 = (pMVar8->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pfVar23 = (pMVar8->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pfVar26 = (pMVar8->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar13 = 0;
      bVar25 = false;
      bVar4 = false;
      piVar16 = (local_6088.
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->_M_elems + 3;
      do {
        iVar17 = (int)lVar13;
        if ((pfVar21 == pfVar2) || ((float)iVar17 * 0.1 < *pfVar21)) {
          if ((bVar25) &&
             (pMVar8->currenttime <= (float)iVar17 * 0.1 &&
              (float)iVar17 * 0.1 != pMVar8->currenttime)) {
            bVar25 = false;
          }
        }
        else {
          bVar25 = (bool)(bVar25 ^ 1);
          pfVar21 = pfVar21 + 1;
        }
        if ((pfVar23 == pfVar26) || ((float)iVar17 * 0.1 < *pfVar23)) {
          if ((bVar4) &&
             (pMVar8->currenttime <= (float)iVar17 * 0.1 &&
              (float)iVar17 * 0.1 != pMVar8->currenttime)) {
            bVar4 = false;
          }
        }
        else {
          bVar4 = (bool)(bVar4 ^ 1);
          pfVar23 = pfVar23 + 1;
        }
        if (bVar25) {
          if (!bVar4) {
            piVar16[-2] = piVar16[-2] + 1;
          }
          if (!bVar25) goto LAB_00102b7a;
LAB_00102b89:
          if (bVar4) {
            *piVar16 = *piVar16 + 1;
          }
        }
        else {
          if (!bVar4) {
            ((array<int,_4UL> *)(piVar16 + -3))->_M_elems[0] =
                 ((array<int,_4UL> *)(piVar16 + -3))->_M_elems[0] + 1;
          }
LAB_00102b7a:
          if (bVar4) {
            piVar16[-1] = piVar16[-1] + 1;
          }
          if (bVar25) goto LAB_00102b89;
        }
        lVar13 = lVar13 + 1;
        piVar16 = piVar16 + 4;
      } while (lVar13 != 3000);
      ppMVar10 = ppMVar10 + 1;
    } while (ppMVar10 !=
             local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_60a8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60a8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60a8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  __s = (pointer)operator_new(24000);
  local_60a8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = __s;
  local_60a8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s;
  local_60a8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 3000;
  memset(__s,0,24000);
  if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppMVar10 = local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar8 = *ppMVar10;
      pfVar21 = (pMVar8->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar2 = (pMVar8->homotetramer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar13 = 0;
      bVar25 = false;
      pfVar23 = __s->_M_elems + 1;
      do {
        if ((pfVar21 != pfVar2) && (*pfVar21 <= (float)(int)lVar13 * 0.1)) {
          bVar25 = (bool)(bVar25 ^ 1);
          pfVar21 = pfVar21 + 1;
        }
        if (bVar25) {
          pfVar26 = __s[lVar13]._M_elems;
LAB_00102ca3:
          *pfVar26 = *pfVar26 + 1.0;
        }
        else {
          pfVar26 = pfVar23;
          if ((float)(int)lVar13 * 0.1 <= pMVar8->currenttime) goto LAB_00102ca3;
        }
        lVar13 = lVar13 + 1;
        pfVar23 = pfVar23 + 2;
      } while (lVar13 != 3000);
      ppMVar10 = ppMVar10 + 1;
    } while (ppMVar10 !=
             local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60a8.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s + 3000;
  paVar9 = (pointer)operator_new(0x69780);
  paVar24 = paVar9 + 3000;
  lVar13 = 0;
  local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = paVar9;
  local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar9;
  local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = paVar24;
  do {
    memset((void *)((long)paVar9->_M_elems + lVar13),0,0x90);
    lVar13 = lVar13 + 0x90;
  } while (lVar13 != 0x69780);
  local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar24;
  if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar22 = "array::at: __n (which is %zu) >= _Nm (which is %zu)";
    ppMVar10 = local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pMVar8 = *ppMVar10;
      uVar14 = 1;
      lVar13 = 0;
      paVar24 = paVar9;
      do {
        if (0 < (int)uVar14) {
          uVar19 = (ulong)(int)(((float)(int)lVar13 * 0.1) / local_60cc);
          piVar3 = (pMVar8->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar15 = (long)(pMVar8->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
          if (uVar15 <= uVar19) {
            pcVar22 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            goto LAB_001039ec;
          }
          uVar14 = piVar3[uVar19];
        }
        uVar19 = (ulong)(int)uVar14;
        if (0x23 < uVar14) {
          uVar15 = 0x24;
LAB_001039ec:
          std::__throw_out_of_range_fmt(pcVar22,uVar19,uVar15);
        }
        paVar24->_M_elems[uVar19] = paVar24->_M_elems[uVar19] + 1;
        lVar13 = lVar13 + 1;
        paVar24 = paVar24 + 1;
      } while (lVar13 != 3000);
      ppMVar10 = ppMVar10 + 1;
    } while (ppMVar10 !=
             local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::ofstream::ofstream(&local_5d88);
  local_5f68 = local_5f58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f68,"nicking_moments.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5f68);
  poVar11 = std::ostream::_M_insert<double>(local_60f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  poVar11 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  plVar12 = (long *)std::ostream::operator<<(poVar11,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector(&local_5eb8,&local_60e8);
  local_5dc0._M_dataplus._M_p = (pointer)&local_5dc0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5dc0,local_5f68,local_5f68 + local_5f60);
  IO::momentsNicking(&local_60f9,&local_5eb8,&local_5dc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5dc0._M_dataplus._M_p != &local_5dc0.field_2) {
    operator_delete(local_5dc0._M_dataplus._M_p);
  }
  if (local_5eb8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5eb8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5f88 = local_5f78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f88,"nicking.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5f88);
  poVar11 = std::ostream::_M_insert<double>(local_60f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  poVar11 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  plVar12 = (long *)std::ostream::operator<<(poVar11,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
            (&local_5ed0,&local_6068);
  local_5de0._M_dataplus._M_p = (pointer)&local_5de0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5de0,local_5f88,local_5f88 + local_5f80);
  IO::writeNicking(&local_60f9,&local_5ed0,&local_5de0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5de0._M_dataplus._M_p != &local_5de0.field_2) {
    operator_delete(local_5de0._M_dataplus._M_p);
  }
  if (local_5ed0.
      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ed0.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6008 = local_5ff8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6008,"dimerBinding.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_6008);
  poVar11 = std::ostream::_M_insert<double>(local_60f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  poVar11 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  plVar12 = (long *)std::ostream::operator<<(poVar11,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            (&local_5ee8,&local_6088);
  local_5e00._M_dataplus._M_p = (pointer)&local_5e00.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e00,local_6008,local_6008 + local_6000);
  IO::writeDimerActivating(&local_60f9,&local_5ee8,&local_5e00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e00._M_dataplus._M_p != &local_5e00.field_2) {
    operator_delete(local_5e00._M_dataplus._M_p);
  }
  if (local_5ee8.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5ee8.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6028 = local_6018;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6028,"dimerBinding_moments.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_6028);
  poVar11 = std::ostream::_M_insert<double>(local_60f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  poVar11 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  plVar12 = (long *)std::ostream::operator<<(poVar11,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector(&local_5f00,&local_60e8);
  local_5e20._M_dataplus._M_p = (pointer)&local_5e20.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e20,local_6028,local_6028 + local_6020);
  IO::momentsActive(&local_60f9,&local_5f00,&local_5e20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e20._M_dataplus._M_p != &local_5e20.field_2) {
    operator_delete(local_5e20._M_dataplus._M_p);
  }
  if (local_5f00.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f00.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_6048 = local_6038;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6048,"homotetramers.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_6048);
  poVar11 = std::ostream::_M_insert<double>(local_60f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  poVar11 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  plVar12 = (long *)std::ostream::operator<<(poVar11,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
            (&local_5f18,&local_60a8);
  local_5e40._M_dataplus._M_p = (pointer)&local_5e40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e40,local_6048,local_6048 + local_6040);
  IO::writeHomotetramers(&local_60f9,&local_5f18,&local_5e40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e40._M_dataplus._M_p != &local_5e40.field_2) {
    operator_delete(local_5e40._M_dataplus._M_p);
  }
  if (local_5f18.
      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f18.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5fa8 = local_5f98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5fa8,"homotetramers_moments.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5fa8);
  poVar11 = std::ostream::_M_insert<double>(local_60f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  poVar11 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  plVar12 = (long *)std::ostream::operator<<(poVar11,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector(&local_5f30,&local_60e8);
  local_5e60._M_dataplus._M_p = (pointer)&local_5e60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e60,local_5fa8,local_5fa8 + local_5fa0);
  IO::momentsHomotetramer(&local_60f9,&local_5f30,&local_5e60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e60._M_dataplus._M_p != &local_5e60.field_2) {
    operator_delete(local_5e60._M_dataplus._M_p);
  }
  if (local_5f30.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f30.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5fc8 = local_5fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5fc8,"statesSingle.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5fc8);
  std::ofstream::close();
  if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pMVar8 = *local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_5e80._M_dataplus._M_p = (pointer)&local_5e80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e80,local_5fc8,local_5fc8 + local_5fc0);
  IO::singleStates(&local_60f9,pMVar8,&local_5e80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e80._M_dataplus._M_p != &local_5e80.field_2) {
    operator_delete(local_5e80._M_dataplus._M_p);
  }
  local_5fe8 = local_5fd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5fe8,"states.tsv","");
  std::ofstream::open((string *)&local_5d88,(_Ios_Openmode)&local_5fe8);
  poVar11 = std::ostream::_M_insert<double>(local_60f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  poVar11 = std::ostream::_M_insert<double>(0.10000000149011612);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
  plVar12 = (long *)std::ostream::operator<<(poVar11,1000);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::ofstream::close();
  std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::vector
            (&local_5f48,&local_60c8);
  local_5ea0._M_dataplus._M_p = (pointer)&local_5ea0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5ea0,local_5fe8,local_5fe8 + local_5fe0);
  IO::writeStates(&local_60f9,&local_5f48,&local_5ea0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5ea0._M_dataplus._M_p != &local_5ea0.field_2) {
    operator_delete(local_5ea0._M_dataplus._M_p);
  }
  if (local_5f48.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f48.
                    super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"finished",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  if (local_5fe8 != local_5fd8) {
    operator_delete(local_5fe8);
  }
  if (local_5fc8 != local_5fb8) {
    operator_delete(local_5fc8);
  }
  if (local_5fa8 != local_5f98) {
    operator_delete(local_5fa8);
  }
  if (local_6048 != local_6038) {
    operator_delete(local_6048);
  }
  if (local_6028 != local_6018) {
    operator_delete(local_6028);
  }
  if (local_6008 != local_5ff8) {
    operator_delete(local_6008);
  }
  if (local_5f88 != local_5f78) {
    operator_delete(local_5f88);
  }
  if (local_5f68 != local_5f58) {
    operator_delete(local_5f68);
  }
  local_5d88 = _VTT;
  *(undefined8 *)(local_5d80 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_5d80);
  std::ios_base::~ios_base(local_5c90);
  if (local_60c8.super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60c8.
                    super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60a8.
      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60a8.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6088.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6088.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6068.
      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6068.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5b88.super_Distribution._vptr_Distribution = (_func_int **)&PTR___cxa_pure_virtual_0010bd00;
  std::random_device::_M_fini();
  if (local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ModelInstance **)0x0) {
    operator_delete(local_60e8.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char ** arg) {
	IO myIO;
	ParameterObj myparameters = myIO.read(argc, arg);

	NetworkArray network(myparameters);		// Set up the network
	const int num_sims = 1000;

	std::vector<ModelInstance*> sims; // create vector of pointers to model objects
	for (int i=0; i<num_sims; i++){
		sims.push_back(new ModelInstance(network, myparameters));
	}

	float totaltime = sims.at(0)->totaltime;
	float dt_reaction = sims.at(0)->dt_react;
	float dt_diffusion = sims.at(0)->dt_diff;
	float dt_plot = 0.1;

	UniformDistribution unif(0,1);
	std::array<std::vector<float>*, num_sims> arr_per_sim{};
	for (auto & it : arr_per_sim) {
		auto *myarr_ptr = new std::vector<float>;
		for (int i = 0; i < (totaltime+30.0)*(1/dt_reaction + 2/dt_diffusion); i++) {
			myarr_ptr->push_back(unif.getRandomNumber());
		}
		it = myarr_ptr;
	}

#pragma omp parallel
	{
#pragma omp for
		for (size_t i = 0; i < num_sims; i++){
			sims.at(i)->main(arr_per_sim.at(i));
		}
	}

	const int numtimesteps = 3000;
	std::vector<std::array<float, 4>> nicking_arr(numtimesteps, std::array<float, 4>{});
	bool nicked1;
	bool nicked2;

	// Create table nicking fractions over time
	for (ModelInstance* model: sims){
		for (int i = 0; i< numtimesteps; i++) {
			nicked1 = model->nick1 >0 && model->nick1 < i*dt_plot;
			nicked2 = model->nick2 >0 && model->nick2 < i*dt_plot;
			if (!nicked1 && !nicked2){
				nicking_arr.at(i).at(0) += 1.0 / num_sims;
			}
			if (nicked1 && !nicked2){
				nicking_arr.at(i).at(1) += 1.0 / num_sims;
			}
			if (!nicked1 && nicked2){
				nicking_arr.at(i).at(2) += 1.0 / num_sims;
			}
			if (nicked1 && nicked2){
				nicking_arr.at(i).at(3) += 1.0 / num_sims;
			}
		}
	}

	// Create table activations over time
	bool first_bound;
	bool second_bound;
	std::vector<std::array<int, 4>> boundarr(numtimesteps, std::array<int, 4>{});
	for (ModelInstance* model: sims){
		first_bound = false;
		second_bound = false;
		auto it1 = model->dimersactive.at(0).begin();
		auto it2 = model->dimersactive.at(1).begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->dimersactive.at(0).end() && *it1 <= i * dt_plot){
				first_bound = !first_bound;
				it1++;
			}
			else if(first_bound && model->currenttime < i * dt_plot){
				first_bound = false;
			}
			if (it2 != model->dimersactive.at(1).end() && *it2 <= i * dt_plot){
				second_bound = !second_bound;
				it2++;
			}
			else if(second_bound && model->currenttime < i * dt_plot){
				second_bound = false;
			}
			if (!first_bound && !second_bound){
				boundarr.at(i).at(0) += 1;
			}
			if (first_bound && !second_bound){
				boundarr.at(i).at(1) += 1;
			}
			if (!first_bound && second_bound){
				boundarr.at(i).at(2) += 1;
			}
			if (first_bound && second_bound){
				boundarr.at(i).at(3) += 1;
			}
		}
	}

	// Create table homo/heterodimers over time
	bool ishomotetramer;
	std::vector<std::array<float,2>> homotetramer_arr(numtimesteps, std::array<float, 2>{});
	for(ModelInstance * model: sims){
		ishomotetramer = false;
		auto it1 = model->homotetramer.begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->homotetramer.end() && *it1 <= i * dt_plot){
				ishomotetramer = !ishomotetramer;
				it1++;
			}
			if(ishomotetramer){
				homotetramer_arr.at(i).at(0) += 1;
			}
			else if(model->currenttime >= i * dt_plot){
				homotetramer_arr.at(i).at(1) += 1;
			}
		}
	}

	// Create table states over tine
	std::vector<std::array<int, 36>> states_arr(numtimesteps, std::array<int, 36>{});
	int index_statesvector;
	int currentstate;
	for (ModelInstance * model: sims) {
		currentstate = 1;
		for (int i=0; i<numtimesteps; i++){
			index_statesvector = float(i)*dt_plot/dt_reaction;
			if (currentstate > 0) {
				currentstate = model->states.at(index_statesvector);
			}
			states_arr.at(i).at(currentstate) += 1;
		}
	}

	std::ofstream out;

	// Save nicking moments
	std::string nickingmoment_file = "nicking_moments.tsv";
	out.open(nickingmoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsNicking(sims, nickingmoment_file);

	// Save nicking fractions over time
	std::string nicking_file = "nicking.tsv";
	out.open(nicking_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeNicking(nicking_arr, nicking_file);

	// Save active dimers over time
	std::string dimerbinding_file = "dimerBinding.tsv";
	out.open(dimerbinding_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeDimerActivating(boundarr, dimerbinding_file);

	// Save binding/unbinding moments
	std::string activemoment_file = "dimerBinding_moments.tsv";
	out.open(activemoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsActive(sims, activemoment_file);

	// Save homo/heterotetramers over time
	std::string homotetramer_file = "homotetramers.tsv";
	out.open(homotetramer_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeHomotetramers(homotetramer_arr, homotetramer_file);

	// Save homotetramer moments
	std::string homotetramermoment_file = "homotetramers_moments.tsv";
	out.open(homotetramermoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsHomotetramer(sims, homotetramermoment_file);

	std::string singleState_file = "statesSingle.tsv";
	out.open(singleState_file);
	out.close();
	myIO.singleStates(sims.at(0), singleState_file);

	std::string states_file = "states.tsv";
	out.open(states_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeStates(states_arr, states_file);

	std::cout << "finished" << std::endl;
	return 0;
}